

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharInfo.h
# Opt level: O0

bool slang::isLogicDigit(char c)

{
  char c_local;
  bool local_1;
  
  if ((((c == '?') || (c == 'X')) || (c == 'Z')) || ((c == 'x' || (c == 'z')))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

constexpr bool isLogicDigit(char c) {
    switch (c) {
        case 'z':
        case 'Z':
        case '?':
        case 'x':
        case 'X':
            return true;
        default:
            return false;
    }
}